

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constructor.cpp
# Opt level: O1

void __thiscall
cppgenerate::Constructor::printSignature
          (Constructor *this,Class *parent,ostream *stream,bool withAccessModifier)

{
  AccessModifier AVar1;
  char cVar2;
  ostream *poVar3;
  undefined7 in_register_00000009;
  long lVar4;
  char *pcVar5;
  string local_40;
  
  cVar2 = (char)stream;
  if ((int)CONCAT71(in_register_00000009,withAccessModifier) != 0) {
    AVar1 = this->m_accessModifier;
    if (AVar1 == PROTECTED) {
      pcVar5 = "protected:";
      lVar4 = 10;
    }
    else if (AVar1 == PRIVATE) {
      pcVar5 = "private:";
      lVar4 = 8;
    }
    else {
      if (AVar1 != PUBLIC) goto LAB_001134a4;
      pcVar5 = "public:";
      lVar4 = 7;
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar5,lVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
  }
LAB_001134a4:
  if (1 < (this->m_documentation)._M_string_length) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"/** ",4);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (stream,(this->m_documentation)._M_dataplus._M_p,
                        (this->m_documentation)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," */",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  Class::getName_abi_cxx11_(&local_40,parent);
  printConstructorSignature(this,stream,&local_40,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,";",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  return;
}

Assistant:

void Constructor::printSignature( const cppgenerate::Class* parent, std::ostream& stream, bool withAccessModifier ) const {
    if( withAccessModifier ){
        switch( m_accessModifier ){
            case AccessModifier::PUBLIC:
                stream << "public:" << std::endl;
                break;
            case AccessModifier::PRIVATE:
                stream << "private:" << std::endl;
                break;
            case AccessModifier::PROTECTED:
                stream << "protected:" << std::endl;
                break;
        }
    }

    if( m_documentation.length() > 1 ){
        stream << "/** " << m_documentation << " */" << std::endl;
    }

    printConstructorSignature( stream, parent->getName(), false );

    stream << ";" << std::endl;
}